

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

bool do_mob_cast(CHAR_DATA *ch)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  CHAR_DATA *arg2;
  char *pcVar4;
  short sVar5;
  CHAR_DATA *pCVar6;
  
  bVar1 = is_npc(ch);
  if (((bVar1) && (ch->fighting != (CHAR_DATA *)0x0)) &&
     (ch->pIndexData->cast_spell[0] != (char *)0x0)) {
    do {
      iVar3 = number_range(0,9);
      pcVar4 = ch->pIndexData->cast_spell[(short)iVar3];
    } while (pcVar4 == (char *)0x0);
    iVar3 = skill_lookup(pcVar4);
    sVar2 = (short)iVar3;
    if (0 < sVar2) {
      if (skill_table[sVar2].target == 1) {
        pCVar6 = ch->in_room->people;
        if (pCVar6 == (CHAR_DATA *)0x0) {
          iVar3 = 0;
        }
        else {
          sVar5 = 0;
          do {
            bVar1 = is_npc(pCVar6);
            if (!bVar1) {
              sVar5 = sVar5 + (ushort)(pCVar6->fighting == ch &&
                                      pCVar6->fighting != (CHAR_DATA *)0x0);
            }
            pCVar6 = pCVar6->next_in_room;
          } while (pCVar6 != (CHAR_DATA *)0x0);
          iVar3 = (int)sVar5;
        }
        iVar3 = number_range(1,iVar3);
        pCVar6 = ch->in_room->people;
        if (pCVar6 != (CHAR_DATA *)0x0) {
          sVar5 = 0;
          do {
            bVar1 = is_npc(pCVar6);
            if (!bVar1) {
              sVar5 = sVar5 + (ushort)(pCVar6->fighting == ch);
            }
            if ((short)iVar3 == sVar5) goto LAB_002c6328;
            pCVar6 = pCVar6->next_in_room;
          } while (pCVar6 != (CHAR_DATA *)0x0);
        }
      }
      pCVar6 = ch->fighting;
LAB_002c6328:
      if (skill_table[sVar2].target == 2) {
        pCVar6 = ch;
      }
      if ((ch->act[0] & 0x10000) == 0) {
        if ((ch->form[0] & 0x20000000) == 0) {
          say_spell(ch,(int)sVar2);
        }
      }
      else {
        if (skill_table[sVar2].target == 2) {
          pcVar4 = "$n closes $s eyes with a look of concentration for a moment.";
          iVar3 = 0;
          arg2 = (CHAR_DATA *)0x0;
        }
        else {
          act("You narrow your eyes and glare in $N\'s direction.",ch,(void *)0x0,pCVar6,3);
          act("$n narrows $s eyes and glares in $N\'s direction.",ch,(void *)0x0,pCVar6,1);
          pcVar4 = "$n narrows $s eyes and glares in your direction.";
          iVar3 = 2;
          arg2 = pCVar6;
        }
        act(pcVar4,ch,(void *)0x0,arg2,iVar3);
      }
      (*skill_table[sVar2].spell_fun)((int)sVar2,(int)ch->level,ch,pCVar6,1);
      return true;
    }
  }
  return false;
}

Assistant:

bool do_mob_cast(CHAR_DATA *ch)
{
	short i, sn, rnd, in_room = 0, room_occupant = 0;
	CHAR_DATA *vch, *victim;

	if (!is_npc(ch) || !ch->fighting || ch->pIndexData->cast_spell[0] == nullptr)
		return false;

	for (;;)
	{
		i = number_range(0, 9);
		if (ch->pIndexData->cast_spell[i] != nullptr)
			break;
	}

	sn = skill_lookup(ch->pIndexData->cast_spell[i]);

	if (sn < 1)
		return false;

	victim = ch->fighting;
	// Share the wealth.
	//
	if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
	{
		for (victim = ch->in_room->people; victim != nullptr; victim = victim->next_in_room)
		{
			if (victim && !is_npc(victim) && victim->fighting && victim->fighting == ch)
				in_room++;
		}

		rnd = number_range(1, in_room);

		for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
		{
			if (!is_npc(vch) && vch->fighting == ch)
				room_occupant++;

			if (rnd == room_occupant)
				break;
		}

		victim = vch != nullptr ? vch : ch->fighting;
	}

	if (skill_table[sn].target == TAR_CHAR_DEFENSIVE)
		victim = ch;

	if (IS_SET(ch->act, ACT_CLERIC))
	{
		if (skill_table[sn].target == TAR_CHAR_DEFENSIVE)
		{
			act("$n closes $s eyes with a look of concentration for a moment.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("You narrow your eyes and glare in $N's direction.", ch, 0, victim, TO_CHAR);
			act("$n narrows $s eyes and glares in $N's direction.", ch, 0, victim, TO_NOTVICT);
			act("$n narrows $s eyes and glares in your direction.", ch, 0, victim, TO_VICT);
		}
	}
	else if (!IS_SET(ch->form, FORM_NOSPEECH))
	{
		say_spell(ch, sn);
	}

	(*skill_table[sn].spell_fun)(sn, ch->level, ch, victim, TAR_CHAR_OFFENSIVE);

	return true;
}